

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O0

void cp_push_type(CPDecl *decl,CTypeID id)

{
  CType *pCVar1;
  CTypeID1 CVar2;
  uint size_00;
  CPDeclIdx CVar3;
  uint local_44;
  CTSize size;
  CTInfo info;
  CType *ct;
  CTypeID id_local;
  CPDecl *decl_local;
  
  pCVar1 = decl->cp->cts->tab + id;
  local_44 = pCVar1->info;
  size_00 = pCVar1->size;
  switch(local_44 >> 0x1c) {
  case 1:
  case 5:
    cp_push(decl,id + 0x70000000,0);
    if ((decl->attr & 0x3000000) != 0) {
      cp_push(decl,0x80010000,decl->attr & 0x3000000);
      decl->attr = decl->attr & 0xfcffffff;
    }
    break;
  default:
    cp_push(decl,local_44 | decl->attr & 0x3000000,size_00);
    decl->attr = decl->attr & 0xfcffffff;
    break;
  case 3:
    if ((pCVar1->info & 0xc000000) != 0) {
      local_44 = decl->attr & 0x3000000 | local_44;
      decl->attr = decl->attr & 0xfcffffff;
    }
    cp_push_type(decl,local_44 & 0xffff);
    cp_push(decl,local_44 & 0xffff0000,size_00);
    decl->stack[decl->pos].sib = 1;
    break;
  case 6:
    CVar2 = pCVar1->sib;
    CVar3 = cp_push(decl,local_44,size_00);
    decl->stack[CVar3].sib = CVar2;
    break;
  case 8:
    if ((local_44 & 0xf0ff0000) == 0x80010000) {
      decl->attr = (size_00 ^ 0xffffffff) & decl->attr;
    }
    cp_push_type(decl,local_44 & 0xffff);
    cp_push(decl,local_44 & 0xffff0000,size_00);
  }
  return;
}

Assistant:

static void cp_push_type(CPDecl *decl, CTypeID id)
{
  CType *ct = ctype_get(decl->cp->cts, id);
  CTInfo info = ct->info;
  CTSize size = ct->size;
  switch (ctype_type(info)) {
  case CT_STRUCT: case CT_ENUM:
    cp_push(decl, CTINFO(CT_TYPEDEF, id), 0);  /* Don't copy unique types. */
    if ((decl->attr & CTF_QUAL)) {  /* Push unmerged qualifiers. */
      cp_push(decl, CTINFO(CT_ATTRIB, CTATTRIB(CTA_QUAL)),
	      (decl->attr & CTF_QUAL));
      decl->attr &= ~CTF_QUAL;
    }
    break;
  case CT_ATTRIB:
    if (ctype_isxattrib(info, CTA_QUAL))
      decl->attr &= ~size;  /* Remove redundant qualifiers. */
    cp_push_type(decl, ctype_cid(info));  /* Unroll. */
    cp_push(decl, info & ~CTMASK_CID, size);  /* Copy type. */
    break;
  case CT_ARRAY:
    if ((ct->info & (CTF_VECTOR|CTF_COMPLEX))) {
      info |= (decl->attr & CTF_QUAL);
      decl->attr &= ~CTF_QUAL;
    }
    cp_push_type(decl, ctype_cid(info));  /* Unroll. */
    cp_push(decl, info & ~CTMASK_CID, size);  /* Copy type. */
    decl->stack[decl->pos].sib = 1;  /* Mark as already checked and sized. */
    /* Note: this is not copied to the ct->sib in the C type table. */
    break;
  case CT_FUNC:
    /* Copy type, link parameters (shared). */
    decl->stack[cp_push(decl, info, size)].sib = ct->sib;
    break;
  default:
    /* Copy type, merge common qualifiers. */
    cp_push(decl, info|(decl->attr & CTF_QUAL), size);
    decl->attr &= ~CTF_QUAL;
    break;
  }
}